

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execCmpiEa<(moira::Instr)39,(moira::Mode)5,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  uint op1;
  ushort in_SI;
  Moira *in_RDI;
  u32 data;
  u32 ea;
  int dst;
  u32 src;
  Moira *in_stack_ffffffffffffffe0;
  u32 in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff4;
  
  uVar2 = readI<(moira::Size)1>(in_stack_ffffffffffffffe0);
  op1 = in_SI & 7;
  bVar1 = readOp<(moira::Mode)5,(moira::Size)1,128ul>
                    (in_RDI,CONCAT22(in_SI,in_stack_fffffffffffffff4),
                     (u32 *)((ulong)CONCAT24(in_SI,in_stack_ffffffffffffffe8) & 0x7ffffffff),
                     (u32 *)in_stack_ffffffffffffffe0);
  if (bVar1) {
    prefetch<0ul>(in_stack_ffffffffffffffe0);
    cmp<(moira::Size)1>((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar2)),op1,
                        in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void
Moira::execCmpiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;
    prefetch();

    cmp<S>(src, data);
}